

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O2

sg_buffer sg_make_buffer(sg_buffer_desc *desc)

{
  undefined4 uVar1;
  sg_buffer sVar2;
  _sg_buffer_t *buf;
  long lVar3;
  sg_buffer_desc *psVar4;
  sg_usage sVar5;
  sg_buffer_desc def;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f02,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
  }
  if (desc == (sg_buffer_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                  ,0x3f03,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
  }
  psVar4 = &def;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&desc->field_0x4;
    psVar4->_start_canary = desc->_start_canary;
    *(undefined4 *)&psVar4->field_0x4 = uVar1;
    desc = (sg_buffer_desc *)&desc->size;
    psVar4 = (sg_buffer_desc *)&psVar4->size;
  }
  sVar5 = def.usage;
  def.type = def.type + (uint)(def.type == _SG_BUFFERTYPE_DEFAULT);
  def.usage = sVar5 + (sVar5 == _SG_USAGE_DEFAULT);
  if (def.size == 0) {
    def.size = def.data.size;
  }
  else if (def.data.size == 0) {
    def.data.size = def.size;
  }
  sVar2 = _sg_alloc_buffer();
  if (sVar2.id == 0) {
    _sg_log("buffer pool exhausted!");
  }
  else {
    buf = _sg_buffer_at((_sg_pools_t *)(ulong)sVar2.id,(uint32_t)desc);
    if ((buf->slot).state != SG_RESOURCESTATE_ALLOC) {
      __assert_fail("buf && (buf->slot.state == SG_RESOURCESTATE_ALLOC)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f08,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
    }
    _sg_init_buffer(buf,&def);
    if (((buf->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
      __assert_fail("(buf->slot.state == SG_RESOURCESTATE_VALID) || (buf->slot.state == SG_RESOURCESTATE_FAILED)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/sokol-src/sokol_gfx.h"
                    ,0x3f0a,"sg_buffer sg_make_buffer(const sg_buffer_desc *)");
    }
  }
  return (sg_buffer)sVar2.id;
}

Assistant:

inline sg_buffer sg_make_buffer(const sg_buffer_desc& desc) { return sg_make_buffer(&desc); }